

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

size_t __thiscall
CCharmapToUniUTF8::read_file(CCharmapToUniUTF8 *this,CVmDataSource *fp,char *buf,size_t bufl)

{
  int iVar1;
  size_t sVar2;
  byte c;
  size_t len;
  ulong uStack_30;
  
  if (bufl < 3) {
    iVar1 = (*fp->_vptr_CVmDataSource[3])(fp,buf,bufl);
    len = (size_t)iVar1;
  }
  else {
    iVar1 = (*fp->_vptr_CVmDataSource[3])(fp,buf,bufl - 2);
    len = (size_t)iVar1;
    if (bufl - 2 <= len) {
      c = buf[len - 1];
      if ((byte)(c >> 7 & ~(c >> 6)) == 0) {
        uStack_30 = 1;
      }
      else {
        if (iVar1 == 1) {
          len = 1;
          goto LAB_001f26f8;
        }
        c = (buf + len)[-2];
        if ((byte)(c >> 7 & ~(c >> 6)) != 0) goto LAB_001f26f8;
        uStack_30 = 2;
      }
      sVar2 = utf8_ptr::s_charsize(c);
      if (uStack_30 <= sVar2 && sVar2 - uStack_30 != 0) {
        iVar1 = (*fp->_vptr_CVmDataSource[3])(fp,buf + len,sVar2 - uStack_30);
        len = len + (long)iVar1;
      }
    }
  }
LAB_001f26f8:
  CCharmapToUni::validate(buf,len);
  return len;
}

Assistant:

size_t CCharmapToUniUTF8::read_file(CVmDataSource *fp,
                                    char *buf, size_t bufl)
{
    size_t read_len;
    char *last_start;
    size_t last_got_len;
    size_t last_need_len;
    
    /* 
     *   Read directly from the file, up the buffer size minus two bytes.
     *   We want to leave two extra bytes so that we can read any extra
     *   continuation bytes for the last character, in order to ensure
     *   that we always read whole characters; in the worst case, the last
     *   character could be three bytes long, in which case we'd need to
     *   read two extra bytes.
     *   
     *   If the available buffer size is less than three bytes, just read
     *   the number of bytes they asked for and don't bother trying to
     *   keep continuation sequences intact.  
     */
    if (bufl < 3)
    {
        read_len = fp->readc(buf, bufl);
        validate(buf, read_len);
        return read_len;
    }

    /* 
     *   read up to the buffer size, less two bytes for possible
     *   continuation bytes 
     */
    read_len = fp->readc(buf, bufl - 2);

    /* 
     *   if we didn't satisfy the entire request, we're at the end of the
     *   file, so there's no point in trying to finish off any
     *   continuation sequences - in this case, just return what we have 
     */
    if (read_len < bufl - 2)
    {
        validate(buf, read_len);
        return read_len;
    }

    /* 
     *   Check the last byte we read to see if there's another byte or two
     *   following. 
     *   
     *   If the last byte is a continuation byte, this is a bit trickier.
     *   We must back up to the preceding lead byte to figure out what we
     *   have in this case.  
     */
    last_start = &buf[read_len - 1];
    last_got_len = 1;
    if (utf8_ptr::s_is_continuation(last_start))
    {
        /* 
         *   if we only read one byte, simply return the one byte - we
         *   started in the middle of a sequence, so there's no way we can
         *   read a complete sequence 
         */
        if (read_len == 1)
        {
            validate(buf, read_len);
            return read_len;
        }

        /* back up to the byte we're continuing from */
        --last_start;
        ++last_got_len;

        /* 
         *   if this is another continuation byte, we've reached the maximum
         *   byte length of three for a single character, so there's no way
         *   we could need to read anything more 
         */
        if (utf8_ptr::s_is_continuation(last_start))
        {
            validate(buf, read_len);
            return read_len;
        }
    }

    /* 
     *   Okay: we have last_start pointing to the start of the last
     *   character, and last_got_len the number of bytes we actually have for
     *   that last character.  If the needed length differs from the length
     *   we actually have, we need to read more.  
     */
    last_need_len = utf8_ptr::s_charsize(*last_start);
    if (last_need_len > last_got_len)
    {
        /* 
         *   we need more than we actually read, so read the remaining
         *   characters 
         */
        read_len += fp->readc(buf + read_len, last_need_len - last_got_len);
    }

    /* validate the buffer - ensure that it's well-formed UTF-8 */
    validate(buf, read_len);

    /* return the length we read */
    return read_len;
}